

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# img2webp.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  WebPMuxError WVar7;
  WebPImageReader p_Var8;
  WebPAnimEncoder *enc;
  WebPMux *mux;
  int iVar9;
  bool bVar10;
  bool bVar11;
  int parse_error;
  uint32_t features;
  WebPData webp_data;
  WebPAnimEncoderOptions anim_config;
  CommandLineArguments cmd_args;
  WebPConfig config;
  WebPPicture pic;
  uint local_250;
  uint local_24c;
  WebPMuxAnimParams local_240;
  int local_238;
  uint local_234;
  uint local_230;
  uint local_22c;
  size_t local_228;
  char *local_220;
  WebPData local_218;
  WebPAnimEncoderOptions local_1fc;
  CommandLineArguments local_1d0;
  WebPConfig local_1a4;
  WebPPicture local_130;
  
  uVar2 = ExUtilInitCommandLineArguments(argc + -1,argv + 1,&local_1d0);
  if (uVar2 == 0) {
    uVar2 = 1;
  }
  else {
    local_218.bytes = (uint8_t *)0x0;
    local_218.size = 0;
    iVar3 = WebPAnimEncoderOptionsInitInternal(&local_1fc,0x108);
    if (((iVar3 == 0) ||
        (iVar3 = WebPConfigInitInternal(&local_1a4,WEBP_PRESET_DEFAULT,75.0,0x20f), iVar3 == 0)) ||
       (iVar3 = WebPPictureInitInternal(&local_130,0x20f), iVar3 == 0)) {
      main_cold_5();
      local_220 = (char *)0x0;
      enc = (WebPAnimEncoder *)0x0;
      local_24c = 0;
      local_250 = 0;
      uVar2 = 0;
    }
    else {
      if (local_1d0.argc_ < 1) {
        local_220 = (char *)0x0;
        bVar11 = true;
        local_250 = 0;
        bVar10 = true;
      }
      else {
        local_238 = 0;
        iVar3 = 0;
        local_250 = 0;
        bVar11 = false;
        local_220 = (char *)0x0;
        do {
          pcVar1 = local_1d0.argv_[iVar3];
          if (*pcVar1 == '-') {
            local_240 = (WebPMuxAnimParams)((ulong)local_240 & 0xffffffff00000000);
            iVar4 = strcmp(pcVar1,"-o");
            if ((iVar4 == 0) && (iVar4 = iVar3 + 1, iVar4 < local_1d0.argc_)) {
              local_1d0.argv_[iVar3] = (char *)0x0;
              local_220 = local_1d0.argv_[iVar4];
              iVar3 = iVar4;
LAB_001050a6:
              uVar2 = (uint)(local_240.bgcolor == 0);
              iVar9 = 4;
              if (local_240.bgcolor == 0) {
                local_1d0.argv_[iVar3] = (char *)0x0;
                iVar9 = 0;
              }
            }
            else {
              iVar4 = strcmp(pcVar1,"-kmin");
              if ((iVar4 == 0) && (iVar4 = iVar3 + 1, iVar4 < local_1d0.argc_)) {
                local_1d0.argv_[iVar3] = (char *)0x0;
                local_1fc.kmin = ExUtilGetInt(local_1d0.argv_[iVar4],0,(int *)&local_240);
                iVar3 = iVar4;
                goto LAB_001050a6;
              }
              iVar4 = strcmp(pcVar1,"-kmax");
              if ((iVar4 == 0) && (iVar4 = iVar3 + 1, iVar4 < local_1d0.argc_)) {
                local_1d0.argv_[iVar3] = (char *)0x0;
                local_1fc.kmax = ExUtilGetInt(local_1d0.argv_[iVar4],0,(int *)&local_240);
                iVar3 = iVar4;
                goto LAB_001050a6;
              }
              iVar4 = strcmp(pcVar1,"-loop");
              if ((iVar4 == 0) && (iVar4 = iVar3 + 1, iVar4 < local_1d0.argc_)) {
                local_1d0.argv_[iVar3] = (char *)0x0;
                local_250 = ExUtilGetInt(local_1d0.argv_[iVar4],0,(int *)&local_240);
                iVar3 = iVar4;
                if ((int)local_250 < 0) {
                  fprintf(_stderr,"Invalid non-positive loop-count (%d)\n",(ulong)local_250);
                  local_240.bgcolor = 1;
                }
                goto LAB_001050a6;
              }
              iVar4 = strcmp(pcVar1,"-min_size");
              if (iVar4 == 0) {
                local_1fc.minimize_size = 1;
                goto LAB_001050a6;
              }
              iVar4 = strcmp(pcVar1,"-mixed");
              if (iVar4 == 0) {
                local_1fc.allow_mixed = 1;
                local_1a4.lossless = 0;
                goto LAB_001050a6;
              }
              iVar4 = strcmp(pcVar1,"-v");
              if (iVar4 == 0) {
                bVar11 = true;
                goto LAB_001050a6;
              }
              iVar4 = strcmp(pcVar1,"-h");
              if ((iVar4 == 0) || (iVar4 = strcmp(pcVar1,"-help"), iVar4 == 0)) {
                puts("Usage:\n");
                puts("  img2webp [file-level options] [image files...] [per-frame options...]");
                putchar(10);
                puts("File-level options (only used at the start of compression):");
                puts(" -min_size ............ minimize size");
                puts(" -loop <int> .......... loop count (default: 0, = infinite loop)");
                puts(
                    " -kmax <int> .......... maximum number of frame between key-frames\n                        (0=only keyframes)"
                    );
                puts(
                    " -kmin <int> .......... minimum number of frame between key-frames\n                        (0=disable key-frames altogether)"
                    );
                puts(" -mixed ............... use mixed lossy/lossless automatic mode");
                puts(" -v ................... verbose mode");
                puts(" -h ................... this help");
                puts(" -version ............. print version number and exit");
                putchar(10);
                puts("Per-frame options (only used for subsequent images input):");
                puts(" -d <int> ............. frame duration in ms (default: 100)");
                puts(" -lossless  ........... use lossless mode (default)");
                puts(" -lossy ... ........... use lossy mode");
                puts(" -q <float> ........... quality");
                puts(" -m <int> ............. method to use");
                putchar(10);
                puts(
                    "example: img2webp -loop 2 in0.png -lossy in1.jpg\n                  -d 80 in2.tiff -o out.webp"
                    );
                puts(
                    "\nNote: if a single file name is passed as the argument, the arguments will be"
                    );
                puts(
                    "tokenized from this file. The file name must not start with the character \'-\'."
                    );
LAB_00105094:
                iVar9 = 4;
              }
              else {
                iVar4 = strcmp(pcVar1,"-version");
                iVar9 = 7;
                if (iVar4 == 0) {
                  uVar5 = WebPGetEncoderVersion();
                  uVar6 = WebPGetMuxVersion();
                  printf("WebP Encoder version: %d.%d.%d\nWebP Mux version: %d.%d.%d\n",
                         (ulong)(uVar5 >> 0x10 & 0xff),(ulong)(uVar5 >> 8 & 0xff),
                         (ulong)(uVar5 & 0xff),(ulong)(uVar6 >> 0x10 & 0xff),
                         (ulong)(uVar6 >> 8 & 0xff),uVar6 & 0xff);
                  goto LAB_00105094;
                }
              }
            }
            if ((iVar9 != 0) && (iVar9 != 7)) {
              if (iVar9 != 4) {
                return 0;
              }
              goto LAB_00105594;
            }
          }
          else {
            local_238 = 1;
          }
        } while ((uVar2 != 0) && (iVar3 = iVar3 + 1, iVar3 < local_1d0.argc_));
        bVar10 = local_238 == 0;
        bVar11 = !bVar11;
      }
      if (bVar10) {
        main_cold_4();
LAB_00105594:
        enc = (WebPAnimEncoder *)0x0;
        local_24c = 0;
      }
      else {
        local_1a4.lossless = 1;
        bVar10 = uVar2 != 0;
        if (local_1d0.argc_ < 1 || !bVar10) {
          enc = (WebPAnimEncoder *)0x0;
          local_24c = 0;
          local_238 = 0;
        }
        else {
          local_22c = 100;
          iVar3 = 0;
          local_234 = 0;
          local_230 = 0;
          local_238 = 0;
          local_24c = 0;
          enc = (WebPAnimEncoder *)0x0;
          do {
            pcVar1 = local_1d0.argv_[iVar3];
            if (pcVar1 != (char *)0x0) {
              if (*pcVar1 != '-') {
                iVar4 = WebPValidateConfig(&local_1a4);
                if (iVar4 == 0) {
                  main_cold_2();
                }
                else {
                  local_130.use_argb = 1;
                  local_240.bgcolor = 0;
                  local_240.loop_count = 0;
                  local_228 = 0;
                  iVar4 = ImgIoUtilReadFile(local_1d0.argv_[iVar3],(uint8_t **)&local_240,&local_228
                                           );
                  if (iVar4 != 0) {
                    p_Var8 = WebPGuessImageReader((uint8_t *)local_240,local_228);
                    uVar2 = 0;
                    iVar4 = (*p_Var8)((uint8_t *)local_240,local_228,&local_130,1,(Metadata *)0x0);
                    WebPFree((void *)local_240);
                    if (iVar4 == 0) goto LAB_001055ae;
                    bVar10 = true;
                    if (enc == (WebPAnimEncoder *)0x0) {
                      local_230 = local_130.width;
                      local_234 = local_130.height;
                      enc = WebPAnimEncoderNewInternal
                                      (local_130.width,local_130.height,&local_1fc,0x108);
                      bVar10 = enc != (WebPAnimEncoder *)0x0;
                      if (enc == (WebPAnimEncoder *)0x0) {
                        main_cold_1();
                        enc = (WebPAnimEncoder *)0x0;
                        bVar10 = false;
                      }
                    }
                    uVar2 = 0;
                    if (bVar10) {
                      if ((local_230 == local_130.width) && (local_234 == local_130.height)) {
                        uVar2 = WebPAnimEncoderAdd(enc,&local_130,local_238,&local_1a4);
                        if (uVar2 == 0) {
                          uVar2 = 0;
                          fprintf(_stderr,"Error while adding frame #%d\n",(ulong)local_24c);
                        }
                      }
                      else {
                        uVar2 = 0;
                        fprintf(_stderr,
                                "Frame #%d dimension mismatched! Got %d x %d. Was expecting %d x %d.\n"
                                ,(ulong)local_24c,(ulong)(uint)local_130.width,
                                (ulong)(uint)local_130.height,(ulong)local_230,local_234);
                      }
                    }
                    WebPPictureFree(&local_130);
                    if (uVar2 != 0) {
                      if (!bVar11) {
                        fprintf(_stderr,"Added frame #%3d at time %4d (file: %s)\n",(ulong)local_24c
                               );
                      }
                      local_238 = local_238 + local_22c;
                      local_24c = local_24c + 1;
                      goto LAB_0010545b;
                    }
                  }
                }
                uVar2 = 0;
                goto LAB_001055ae;
              }
              local_240 = (WebPMuxAnimParams)((ulong)local_240 & 0xffffffff00000000);
              iVar4 = strcmp(pcVar1,"-lossy");
              if (iVar4 == 0) {
                if (local_1fc.allow_mixed == 0) {
                  local_1a4.lossless = 0;
                }
              }
              else {
                iVar4 = strcmp(pcVar1,"-lossless");
                if (iVar4 == 0) {
                  if (local_1fc.allow_mixed == 0) {
                    local_1a4.lossless = 1;
                  }
                }
                else {
                  iVar4 = strcmp(pcVar1,"-q");
                  if ((iVar4 == 0) && (iVar3 + 1 < local_1d0.argc_)) {
                    local_1a4.quality = ExUtilGetFloat(local_1d0.argv_[iVar3 + 1],(int *)&local_240)
                    ;
                  }
                  else {
                    iVar4 = strcmp(pcVar1,"-m");
                    if ((iVar4 == 0) && (iVar3 + 1 < local_1d0.argc_)) {
                      local_1a4.method =
                           ExUtilGetInt(local_1d0.argv_[iVar3 + 1],0,(int *)&local_240);
                    }
                    else {
                      iVar4 = strcmp(pcVar1,"-d");
                      if ((iVar4 != 0) || (local_1d0.argc_ <= iVar3 + 1)) {
                        local_240.bgcolor = 1;
                        fprintf(_stderr,"Unknown option [%s]\n",pcVar1);
                        goto LAB_00105449;
                      }
                      local_22c = ExUtilGetInt(local_1d0.argv_[iVar3 + 1],0,(int *)&local_240);
                      if ((int)local_22c < 1) {
                        fprintf(_stderr,"Invalid negative duration (%d)\n",(ulong)local_22c);
                        local_240.bgcolor = 1;
                      }
                    }
                  }
                  iVar3 = iVar3 + 1;
                }
              }
LAB_00105449:
              uVar2 = (uint)(local_240.bgcolor == 0);
              if (local_240.bgcolor != 0) goto LAB_001055ae;
            }
LAB_0010545b:
            bVar10 = uVar2 != 0;
          } while ((bVar10) && (iVar3 = iVar3 + 1, iVar3 < local_1d0.argc_));
        }
        bVar11 = false;
        if ((bVar10) &&
           (iVar3 = WebPAnimEncoderAdd(enc,(WebPPicture *)0x0,local_238,(WebPConfig *)0x0),
           bVar11 = false, iVar3 != 0)) {
          iVar3 = WebPAnimEncoderAssemble(enc,&local_218);
          bVar11 = iVar3 != 0;
        }
        uVar2 = (uint)bVar11;
        if (bVar11 == false) {
          main_cold_3();
        }
      }
    }
LAB_001055ae:
    WebPAnimEncoderDelete(enc);
    if ((uVar2 != 0) && (0 < (int)local_250)) {
      mux = WebPMuxCreateInternal(&local_218,1,0x108);
      if (mux == (WebPMux *)0x0) {
        bVar10 = false;
      }
      else {
        WVar7 = WebPMuxGetFeatures(mux,(uint32_t *)&local_228);
        bVar10 = WVar7 == WEBP_MUX_OK;
        if ((bVar10) && (bVar10 = true, (local_228 & 2) != 0)) {
          WVar7 = WebPMuxGetAnimationParams(mux,&local_240);
          bVar10 = WVar7 == WEBP_MUX_OK;
          if (bVar10) {
            local_240.loop_count = local_250;
            WVar7 = WebPMuxSetAnimationParams(mux,&local_240);
            bVar10 = WVar7 == WEBP_MUX_OK;
          }
          if (bVar10) {
            WebPFree(local_218.bytes);
            local_218.bytes = (uint8_t *)0x0;
            local_218.size = 0;
            WVar7 = WebPMuxAssemble(mux,&local_218);
            bVar10 = WVar7 == WEBP_MUX_OK;
          }
          else {
            bVar10 = false;
          }
        }
        WebPMuxDelete(mux);
        if (!bVar10) {
          main_cold_6();
        }
      }
      uVar2 = (uint)bVar10;
    }
    pcVar1 = local_220;
    bVar10 = true;
    if (uVar2 != 0) {
      if (local_220 == (char *)0x0) {
        main_cold_7();
        bVar10 = false;
      }
      else {
        iVar3 = ImgIoUtilWriteFile(local_220,local_218.bytes,local_218.size);
        if (iVar3 != 0) {
          bVar10 = false;
          fprintf(_stderr,"output file: %s     ",pcVar1);
        }
      }
    }
    if (!bVar10) {
      fprintf(_stderr,"[%d frames, %u bytes].\n",(ulong)local_24c,local_218.size & 0xffffffff);
    }
    WebPFree(local_218.bytes);
    local_218.bytes = (uint8_t *)0x0;
    local_218.size = 0;
    ExUtilDeleteCommandLineArguments(&local_1d0);
    uVar2 = (uint)bVar10;
  }
  return uVar2;
}

Assistant:

int main(int argc, const char* argv[]) {
  const char* output = NULL;
  WebPAnimEncoder* enc = NULL;
  int verbose = 0;
  int pic_num = 0;
  int duration = 100;
  int timestamp_ms = 0;
  int loop_count = 0;
  int width = 0, height = 0;
  WebPAnimEncoderOptions anim_config;
  WebPConfig config;
  WebPPicture pic;
  WebPData webp_data;
  int c;
  int have_input = 0;
  CommandLineArguments cmd_args;
  int ok;

  INIT_WARGV(argc, argv);

  ok = ExUtilInitCommandLineArguments(argc - 1, argv + 1, &cmd_args);
  if (!ok) FREE_WARGV_AND_RETURN(1);

  argc = cmd_args.argc_;
  argv = cmd_args.argv_;

  WebPDataInit(&webp_data);
  if (!WebPAnimEncoderOptionsInit(&anim_config) ||
      !WebPConfigInit(&config) ||
      !WebPPictureInit(&pic)) {
    fprintf(stderr, "Library version mismatch!\n");
    ok = 0;
    goto End;
  }

  // 1st pass of option parsing
  for (c = 0; ok && c < argc; ++c) {
    if (argv[c][0] == '-') {
      int parse_error = 0;
      if (!strcmp(argv[c], "-o") && c + 1 < argc) {
        argv[c] = NULL;
        output = (const char*)GET_WARGV_SHIFTED(argv, ++c);
      } else if (!strcmp(argv[c], "-kmin") && c + 1 < argc) {
        argv[c] = NULL;
        anim_config.kmin = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-kmax") && c + 1 < argc) {
        argv[c] = NULL;
        anim_config.kmax = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-loop") && c + 1 < argc) {
        argv[c] = NULL;
        loop_count = ExUtilGetInt(argv[++c], 0, &parse_error);
        if (loop_count < 0) {
          fprintf(stderr, "Invalid non-positive loop-count (%d)\n", loop_count);
          parse_error = 1;
        }
      } else if (!strcmp(argv[c], "-min_size")) {
        anim_config.minimize_size = 1;
      } else if (!strcmp(argv[c], "-mixed")) {
        anim_config.allow_mixed = 1;
        config.lossless = 0;
      } else if (!strcmp(argv[c], "-v")) {
        verbose = 1;
      } else if (!strcmp(argv[c], "-h") || !strcmp(argv[c], "-help")) {
        Help();
        goto End;
      } else if (!strcmp(argv[c], "-version")) {
        const int enc_version = WebPGetEncoderVersion();
        const int mux_version = WebPGetMuxVersion();
        printf("WebP Encoder version: %d.%d.%d\nWebP Mux version: %d.%d.%d\n",
               (enc_version >> 16) & 0xff, (enc_version >> 8) & 0xff,
               enc_version & 0xff, (mux_version >> 16) & 0xff,
               (mux_version >> 8) & 0xff, mux_version & 0xff);
        goto End;
      } else {
        continue;
      }
      ok = !parse_error;
      if (!ok) goto End;
      argv[c] = NULL;   // mark option as 'parsed' during 1st pass
    } else {
      have_input |= 1;
    }
  }
  if (!have_input) {
    fprintf(stderr, "No input file(s) for generating animation!\n");
    goto End;
  }

  // image-reading pass
  pic_num = 0;
  config.lossless = 1;
  for (c = 0; ok && c < argc; ++c) {
    if (argv[c] == NULL) continue;
    if (argv[c][0] == '-') {    // parse local options
      int parse_error = 0;
      if (!strcmp(argv[c], "-lossy")) {
        if (!anim_config.allow_mixed) config.lossless = 0;
      } else if (!strcmp(argv[c], "-lossless")) {
        if (!anim_config.allow_mixed) config.lossless = 1;
      } else if (!strcmp(argv[c], "-q") && c + 1 < argc) {
        config.quality = ExUtilGetFloat(argv[++c], &parse_error);
      } else if (!strcmp(argv[c], "-m") && c + 1 < argc) {
        config.method = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-d") && c + 1 < argc) {
        duration = ExUtilGetInt(argv[++c], 0, &parse_error);
        if (duration <= 0) {
          fprintf(stderr, "Invalid negative duration (%d)\n", duration);
          parse_error = 1;
        }
      } else {
        parse_error = 1;   // shouldn't be here.
        fprintf(stderr, "Unknown option [%s]\n", argv[c]);
      }
      ok = !parse_error;
      if (!ok) goto End;
      continue;
    }

    if (ok) {
      ok = WebPValidateConfig(&config);
      if (!ok) {
        fprintf(stderr, "Invalid configuration.\n");
        goto End;
      }
    }

    // read next input image
    pic.use_argb = 1;
    ok = ReadImage((const char*)GET_WARGV_SHIFTED(argv, c), &pic);
    if (!ok) goto End;

    if (enc == NULL) {
      width  = pic.width;
      height = pic.height;
      enc = WebPAnimEncoderNew(width, height, &anim_config);
      ok = (enc != NULL);
      if (!ok) {
        fprintf(stderr, "Could not create WebPAnimEncoder object.\n");
      }
    }

    if (ok) {
      ok = (width == pic.width && height == pic.height);
      if (!ok) {
        fprintf(stderr, "Frame #%d dimension mismatched! "
                        "Got %d x %d. Was expecting %d x %d.\n",
                pic_num, pic.width, pic.height, width, height);
      }
    }

    if (ok) {
      ok = WebPAnimEncoderAdd(enc, &pic, timestamp_ms, &config);
      if (!ok) {
        fprintf(stderr, "Error while adding frame #%d\n", pic_num);
      }
    }
    WebPPictureFree(&pic);
    if (!ok) goto End;

    if (verbose) {
      WFPRINTF(stderr, "Added frame #%3d at time %4d (file: %s)\n",
               pic_num, timestamp_ms, GET_WARGV_SHIFTED(argv, c));
    }
    timestamp_ms += duration;
    ++pic_num;
  }

  // add a last fake frame to signal the last duration
  ok = ok && WebPAnimEncoderAdd(enc, NULL, timestamp_ms, NULL);
  ok = ok && WebPAnimEncoderAssemble(enc, &webp_data);
  if (!ok) {
    fprintf(stderr, "Error during final animation assembly.\n");
  }

 End:
  // free resources
  WebPAnimEncoderDelete(enc);

  if (ok && loop_count > 0) {  // Re-mux to add loop count.
    ok = SetLoopCount(loop_count, &webp_data);
  }

  if (ok) {
    if (output != NULL) {
      ok = ImgIoUtilWriteFile(output, webp_data.bytes, webp_data.size);
      if (ok) WFPRINTF(stderr, "output file: %s     ", (const W_CHAR*)output);
    } else {
      fprintf(stderr, "[no output file specified]   ");
    }
  }

  if (ok) {
    fprintf(stderr, "[%d frames, %u bytes].\n",
            pic_num, (unsigned int)webp_data.size);
  }
  WebPDataClear(&webp_data);
  ExUtilDeleteCommandLineArguments(&cmd_args);
  FREE_WARGV_AND_RETURN(ok ? 0 : 1);
}